

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharItem.cpp
# Opt level: O3

bool __thiscall Hpipe::CharItem::apply_rec(CharItem *this,function<bool_(Hpipe::CharItem_*)> *f)

{
  pointer pCVar1;
  CharItem *this_00;
  bool bVar2;
  bool bVar3;
  pointer pCVar4;
  CharItem *local_58;
  _Any_data local_50;
  code *local_40;
  
  bVar3 = true;
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    local_58 = this;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    bVar2 = (*f->_M_invoker)((_Any_data *)f,&local_58);
    if (bVar2) {
      pCVar4 = (this->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
               super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar1 = (this->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
               super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pCVar4 != pCVar1) {
        bVar3 = true;
        do {
          this_00 = pCVar4->item;
          std::function<bool_(Hpipe::CharItem_*)>::function
                    ((function<bool_(Hpipe::CharItem_*)> *)&local_50,f);
          bVar2 = apply_rec(this_00,(function<bool_(Hpipe::CharItem_*)> *)&local_50);
          if (local_40 != (code *)0x0) {
            (*local_40)(&local_50,&local_50,__destroy_functor);
          }
          bVar3 = (bool)(bVar3 & bVar2);
          pCVar4 = pCVar4 + 1;
        } while (pCVar4 != pCVar1);
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool CharItem::apply_rec( std::function<bool( CharItem * )> f ) {
    if ( op_id == CharItem::cur_op_id )
        return true;
    op_id = CharItem::cur_op_id;

    if ( not f( this ) )
        return false;

    bool res = true;
    for( CharEdge &t : edges )
        if ( not t.item->apply_rec( f ) )
            res = false;
    return res;
}